

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEdit::changeEvent(QTextEdit *this,QEvent *e)

{
  short sVar1;
  QTextEditPrivate *this_00;
  QScrollBar *this_01;
  QWidgetTextControl *pQVar2;
  bool bVar3;
  LayoutDirection LVar4;
  int iVar5;
  int iVar6;
  QTextDocument *pQVar7;
  QPalette *pQVar8;
  long in_FS_OFFSET;
  QPointF local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  QFrame::changeEvent((QFrame *)this,e);
  sVar1 = *(short *)(e + 8);
  switch(sVar1) {
  case 0x5a:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QTextEditPrivate::sendControlEvent(this_00,e);
      return;
    }
    goto LAB_004a2bdc;
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
    break;
  case 0x61:
switchD_004a2a22_caseD_61:
    pQVar7 = QWidgetTextControl::document((QWidgetTextControl *)this_00->control);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QTextDocument::setDefaultFont((QFont *)pQVar7);
      return;
    }
    goto LAB_004a2bdc;
  case 0x62:
    (**(code **)(*(long *)e + 0x10))
              (e,(((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->
                  widget_attributes & 1) == 0);
    pQVar2 = (QWidgetTextControl *)this_00->control;
    pQVar8 = QWidget::palette((QWidget *)this);
    QWidgetTextControl::setPalette(pQVar2,pQVar8);
    pQVar2 = (QWidgetTextControl *)this_00->control;
    LVar4 = QWidget::layoutDirection
                      (*(QWidget **)
                        &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate.field_0x8);
    this_01 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar4 == RightToLeft) {
      iVar5 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
      iVar6 = QAbstractSlider::value
                        (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider)
      ;
      iVar5 = iVar5 - iVar6;
    }
    else {
      iVar5 = QAbstractSlider::value(&this_01->super_QAbstractSlider);
    }
    iVar6 = QAbstractSlider::value
                      (&((this_00->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
    local_40.yp = (qreal)iVar6;
    local_40.xp = (double)iVar5;
    QWidgetTextControl::processEvent
              (pQVar2,e,&local_40,(this_00->super_QAbstractScrollAreaPrivate).viewport);
    break;
  case 99:
    bVar3 = QWidget::isActiveWindow((QWidget *)this);
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QBasicTimer::stop();
        return;
      }
      goto LAB_004a2bdc;
    }
    break;
  default:
    if (sVar1 == 0x27) {
      pQVar2 = (QWidgetTextControl *)this_00->control;
      pQVar8 = QWidget::palette((QWidget *)this);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QWidgetTextControl::setPalette(pQVar2,pQVar8);
        return;
      }
      goto LAB_004a2bdc;
    }
    if (sVar1 == 0x24) goto switchD_004a2a22_caseD_61;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_004a2bdc:
  __stack_chk_fail();
}

Assistant:

void QTextEdit::changeEvent(QEvent *e)
{
    Q_D(QTextEdit);
    QAbstractScrollArea::changeEvent(e);
    if (e->type() == QEvent::ApplicationFontChange
        || e->type() == QEvent::FontChange) {
        d->control->document()->setDefaultFont(font());
    }  else if (e->type() == QEvent::ActivationChange) {
        if (!isActiveWindow())
            d->autoScrollTimer.stop();
    } else if (e->type() == QEvent::EnabledChange) {
        e->setAccepted(isEnabled());
        d->control->setPalette(palette());
        d->sendControlEvent(e);
    } else if (e->type() == QEvent::PaletteChange) {
        d->control->setPalette(palette());
    } else if (e->type() == QEvent::LayoutDirectionChange) {
        d->sendControlEvent(e);
    }
}